

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall Descriptor_Parse_combo_Test::TestBody(Descriptor_Parse_combo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_390;
  AssertionResult gtest_ar_;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> combo_list;
  AssertHelper local_360;
  AssertionResult gtest_ar;
  string desc_str;
  string descriptor;
  Script locking_script;
  Descriptor desc;
  
  std::__cxx11::string::string
            ((string *)&descriptor,
             "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
             (allocator *)&desc);
  cfd::core::Descriptor::Descriptor(&desc);
  cfd::core::Script::Script(&locking_script);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&desc_str,"",(allocator *)&gtest_ar);
  combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::Parse
                ((Descriptor *)&gtest_ar,&descriptor,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=(&desc,(Descriptor *)&gtest_ar);
      cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x79,
               "Expected: desc = Descriptor::Parse(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript((Script *)&gtest_ar,&desc);
      cfd::core::Script::operator=(&locking_script,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7a,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_((string *)&gtest_ar,&desc,false);
      std::__cxx11::string::operator=((string *)&desc_str,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7b,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScriptAll
                ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)&gtest_ar,&desc,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::_M_move_assign
                (&combo_list,&gtest_ar);
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
                ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7c,
               "Expected: combo_list = desc.GetLockingScriptAll() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = cfd::core::Descriptor::IsComboScript(&desc);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"desc.IsComboScript()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_390);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"desc_str.c_str()","descriptor.c_str()",desc_str._M_dataplus._M_p
             ,descriptor._M_dataplus._M_p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::ToString_abi_cxx11_((string *)&gtest_ar,&locking_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_,"locking_script.ToString().c_str()",
             "\"0 751e76e8199196d454941c45d1b3a323f1433bd6\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "0 751e76e8199196d454941c45d1b3a323f1433bd6");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ =
       ((long)combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_finish -
       (long)combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
             _M_impl.super__Vector_impl_data._M_start) / 0x38;
  local_390.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"combo_list.size()","4",(unsigned_long *)&gtest_ar_,
             (int *)&local_390);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if ((long)combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
            _M_impl.super__Vector_impl_data._M_start == 0xe0) {
    cfd::core::Script::ToString_abi_cxx11_
              ((string *)&gtest_ar,
               combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
               _M_impl.super__Vector_impl_data._M_start);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_,"combo_list[0].ToString().c_str()",
               "\"0 751e76e8199196d454941c45d1b3a323f1433bd6\"",
               (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
               "0 751e76e8199196d454941c45d1b3a323f1433bd6");
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x84,pcVar2);
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    cfd::core::Script::ToString_abi_cxx11_
              ((string *)&gtest_ar,
               combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
               _M_impl.super__Vector_impl_data._M_start + 1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_,"combo_list[1].ToString().c_str()",
               "\"OP_HASH160 bcfeb728b584253d5f3f70bcb780e9ef218a68f4 OP_EQUAL\"",
               (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
               "OP_HASH160 bcfeb728b584253d5f3f70bcb780e9ef218a68f4 OP_EQUAL");
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x86,pcVar2);
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    cfd::core::Script::ToString_abi_cxx11_
              ((string *)&gtest_ar,
               combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_,"combo_list[2].ToString().c_str()",
               "\"OP_DUP OP_HASH160 751e76e8199196d454941c45d1b3a323f1433bd6 OP_EQUALVERIFY OP_CHECKSIG\""
               ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
               "OP_DUP OP_HASH160 751e76e8199196d454941c45d1b3a323f1433bd6 OP_EQUALVERIFY OP_CHECKSIG"
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x88,pcVar2);
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    cfd::core::Script::ToString_abi_cxx11_
              ((string *)&gtest_ar,
               combo_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_,"combo_list[3].ToString().c_str()",
               "\"0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798 OP_CHECKSIG\"",
               (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
               "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798 OP_CHECKSIG");
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
                 ,0x8a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&combo_list);
  std::__cxx11::string::~string((string *)&desc_str);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  std::__cxx11::string::~string((string *)&descriptor);
  return;
}

Assistant:

TEST(Descriptor, Parse_combo) {
  std::string descriptor = "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  std::vector<Script> combo_list;

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(combo_list = desc.GetLockingScriptAll());
  EXPECT_TRUE(desc.IsComboScript());
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "0 751e76e8199196d454941c45d1b3a323f1433bd6");
  EXPECT_EQ(combo_list.size(), 4);
  if (combo_list.size() == 4) {
    EXPECT_STREQ(combo_list[0].ToString().c_str(),
        "0 751e76e8199196d454941c45d1b3a323f1433bd6");
    EXPECT_STREQ(combo_list[1].ToString().c_str(),
        "OP_HASH160 bcfeb728b584253d5f3f70bcb780e9ef218a68f4 OP_EQUAL");
    EXPECT_STREQ(combo_list[2].ToString().c_str(),
        "OP_DUP OP_HASH160 751e76e8199196d454941c45d1b3a323f1433bd6 OP_EQUALVERIFY OP_CHECKSIG");
    EXPECT_STREQ(combo_list[3].ToString().c_str(),
        "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798 OP_CHECKSIG");
  }
}